

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-arch.cpp
# Opt level: O1

string * __thiscall LLM_TN_IMPL::str_abi_cxx11_(string *__return_storage_ptr__,LLM_TN_IMPL *this)

{
  llm_tensor *__k;
  mapped_type *pmVar1;
  _Base_ptr p_Var2;
  mapped_type *ppcVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  
  pmVar1 = std::
           map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
           ::at(&LLM_TENSOR_NAMES,&this->arch);
  __k = &this->tensor;
  p_Var4 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header;
  p_Var2 = p_Var5;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      if ((int)*__k <= (int)p_Var4[1]._M_color) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < (int)*__k];
    } while (p_Var4 != (_Base_ptr)0x0);
  }
  if ((p_Var2 != p_Var5) && ((int)p_Var2[1]._M_color <= (int)*__k)) {
    p_Var5 = p_Var2;
  }
  pmVar1 = std::
           map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
           ::at(&LLM_TENSOR_NAMES,&this->arch);
  if ((_Rb_tree_header *)p_Var5 == &(pmVar1->_M_t)._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"__missing__","");
  }
  else {
    pmVar1 = std::
             map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
             ::at(&LLM_TENSOR_NAMES,&this->arch);
    ppcVar3 = std::
              map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>
              ::at(pmVar1,__k);
    format_abi_cxx11_(__return_storage_ptr__,*ppcVar3,(ulong)(uint)this->bid,(ulong)(uint)this->xid)
    ;
    if (this->suffix != (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LLM_TN_IMPL::str() const {
    if (LLM_TENSOR_NAMES.at(arch).find(tensor) == LLM_TENSOR_NAMES.at(arch).end()) {
        return "__missing__";
    }

    std::string name = ::format(LLM_TENSOR_NAMES.at(arch).at(tensor), bid, xid);

    if (suffix != nullptr) {
        name += ".";
        name += suffix;
    }

    return name;
}